

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

void SplitPath(tchar_t *URL,tchar_t *Dir,int DirLen,tchar_t *Name,int NameLen,tchar_t *Ext,
              int ExtLen)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  tchar_t *NulChar;
  tchar_t Protocol [256];
  tchar_t LocalURL [256];
  bool_t HasHost;
  tchar_t *p3;
  tchar_t *p2;
  tchar_t *p;
  tchar_t *Ext_local;
  int NameLen_local;
  tchar_t *Name_local;
  int DirLen_local;
  tchar_t *Dir_local;
  tchar_t *URL_local;
  
  Dir_local = GetProtocol(URL,(tchar_t *)&NulChar,0x100,(bool_t *)(LocalURL + 0xf8));
  p3 = strrchr(Dir_local,0x5c);
  pcVar2 = strrchr(Dir_local,0x2f);
  if ((p3 == (char *)0x0) || ((pcVar2 != (char *)0x0 && (p3 < pcVar2)))) {
    p3 = pcVar2;
  }
  if (p3 == (tchar_t *)0x0) {
    if (LocalURL._248_8_ == 0) {
      if (Dir != (tchar_t *)0x0) {
        tcsncpy_s(Dir,(long)DirLen,URL,(long)Dir_local - (long)URL);
      }
    }
    else {
      if (Dir != (tchar_t *)0x0) {
        tcscpy_s(Dir,(long)DirLen,URL);
      }
      sVar3 = strlen(URL);
      Dir_local = URL + sVar3;
    }
  }
  else {
    if (Dir != (tchar_t *)0x0) {
      tcsncpy_s(Dir,(long)DirLen,URL,(long)p3 - (long)URL);
    }
    Dir_local = p3 + 1;
  }
  iVar1 = tcsicmp((tchar_t *)&NulChar,"http");
  if ((iVar1 == 0) && (pcVar2 = strrchr(Dir_local,0x23), pcVar2 != (char *)0x0)) {
    tcscpy_s(Protocol + 0xf8,0x100,Dir_local);
    Dir_local = Protocol + 0xf8;
    pcVar2 = strrchr(Protocol + 0xf8,0x23);
    *pcVar2 = '\0';
  }
  if ((Name == (tchar_t *)0x0) || (Name != Ext)) {
    p2 = strrchr(Dir_local,0x2e);
    if (p2 == (char *)0x0) {
      if (Name != (tchar_t *)0x0) {
        tcscpy_s(Name,(long)NameLen,Dir_local);
      }
      if (Ext != (tchar_t *)0x0) {
        *Ext = '\0';
      }
    }
    else {
      if (Name != (tchar_t *)0x0) {
        tcsncpy_s(Name,(long)NameLen,Dir_local,(long)p2 - (long)Dir_local);
      }
      if (Ext != (tchar_t *)0x0) {
        if (p2[1] != '\0') {
          p2 = p2 + 1;
        }
        tcscpy_s(Ext,(long)ExtLen,p2);
      }
    }
  }
  else {
    tcscpy_s(Name,(long)NameLen,Dir_local);
  }
  return;
}

Assistant:

void SplitPath(const tchar_t* URL, tchar_t* Dir, int DirLen, tchar_t* Name, int NameLen, tchar_t* Ext, int ExtLen)
{
    const tchar_t *p,*p2,*p3;
    bool_t HasHost;
    tchar_t LocalURL[MAXPATH];
    tchar_t Protocol[MAXPATH];

    // mime
    p = GetProtocol(URL,Protocol,TSIZEOF(Protocol),&HasHost);

    // dir
    p2 = tcsrchr(p,'\\');
    p3 = tcsrchr(p,'/');
    if (!p2 || (p3 && p3>p2))
        p2 = p3;

    if (p2)
    {
        if (Dir)
            tcsncpy_s(Dir,DirLen,URL,p2-URL);
        URL = p2+1;
    }
    else
    if (HasHost) // no filename, only host
    {
        if (Dir)
            tcscpy_s(Dir,DirLen,URL);
        URL += tcslen(URL);
    }
    else // no directory
    {
        if (Dir)
            tcsncpy_s(Dir,DirLen,URL,p-URL);
        URL = p;
    }

    // name
    if (tcsicmp(Protocol,T("http"))==0 && tcsrchr(URL,T('#')))
    {
        tchar_t *NulChar;
        tcscpy_s(LocalURL,TSIZEOF(LocalURL),URL);
        URL = LocalURL;
        NulChar = tcsrchr(LocalURL,T('#'));
        *NulChar = 0;
    }

    if (Name && Name == Ext)
        tcscpy_s(Name,NameLen,URL);
    else
    {
        p = tcsrchr(URL,'.');
        if (p)
        {
            if (Name)
                tcsncpy_s(Name,NameLen,URL,p-URL);
            if (Ext)
            {
                if (p[1]) ++p; // remove '.', but only if there is a real extension
                tcscpy_s(Ext,ExtLen,p);
            }
        }
        else
        {
            if (Name)
                tcscpy_s(Name,NameLen,URL);
            if (Ext)
                Ext[0] = 0;
        }
    }
}